

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

mi_subproc_id_t mi_subproc_new(void)

{
  void *pvVar1;
  mi_memid_t memid;
  anon_union_16_2_8cef793c_for_mem local_28;
  undefined8 local_18;
  
  local_28.os.base = (void *)0x0;
  local_28.os.size = 0;
  local_18 = 0;
  pvVar1 = _mi_arena_meta_zalloc(0x88,(mi_memid_t *)&local_28.os);
  if (pvVar1 == (void *)0x0) {
    pvVar1 = (void *)0x0;
  }
  else {
    *(undefined8 *)((long)pvVar1 + 0x80) = local_18;
    *(void **)((long)pvVar1 + 0x70) = local_28.os.base;
    *(size_t *)((long)pvVar1 + 0x78) = local_28.os.size;
    *(undefined8 *)((long)pvVar1 + 0x60) = 0;
    pthread_mutex_init((pthread_mutex_t *)((long)pvVar1 + 0x10),(pthread_mutexattr_t *)0x0);
    pthread_mutex_init((pthread_mutex_t *)((long)pvVar1 + 0x38),(pthread_mutexattr_t *)0x0);
  }
  return pvVar1;
}

Assistant:

mi_subproc_id_t mi_subproc_new(void) {
  mi_memid_t memid = _mi_memid_none();
  mi_subproc_t* subproc = (mi_subproc_t*)_mi_arena_meta_zalloc(sizeof(mi_subproc_t), &memid);
  if (subproc == NULL) return NULL;
  subproc->memid = memid;
  subproc->abandoned_os_list = NULL;
  mi_lock_init(&subproc->abandoned_os_lock);
  mi_lock_init(&subproc->abandoned_os_visit_lock);
  return subproc;
}